

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectAnimation(XFileParser *this,Animation *pAnim)

{
  bool bVar1;
  Logger *this_00;
  AnimBone *banim;
  string objectName;
  allocator<char> local_79;
  AnimBone *local_78;
  string local_70;
  string local_50;
  
  readHeadOfDataObject(this,(string *)0x0);
  local_78 = (AnimBone *)operator_new(0x80);
  (local_78->mBoneName)._M_dataplus._M_p = (pointer)&(local_78->mBoneName).field_2;
  (local_78->mBoneName)._M_string_length = 0;
  (local_78->mBoneName).field_2._M_local_buf[0] = '\0';
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>::push_back
            (&pAnim->mAnims,&local_78);
  do {
    GetNextToken_abi_cxx11_(&local_50,this);
    if (local_50._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unexpected end of file while parsing animation.",&local_79);
      ThrowException(this,&local_70);
    }
    bVar1 = std::operator==(&local_50,"}");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    bVar1 = std::operator==(&local_50,"AnimationKey");
    if (bVar1) {
      ParseDataObjectAnimationKey(this,local_78);
    }
    else {
      bVar1 = std::operator==(&local_50,"AnimationOptions");
      if (!bVar1) {
        bVar1 = std::operator==(&local_50,"{");
        if (bVar1) {
          GetNextToken_abi_cxx11_(&local_70,this);
          std::__cxx11::string::operator=((string *)local_78,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          CheckForClosingBrace(this);
          goto LAB_004d49b5;
        }
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Unknown data object in animation in x file");
      }
      ParseUnknownDataObject(this);
    }
LAB_004d49b5:
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectAnimation( Animation* pAnim)
{
    readHeadOfDataObject();
    AnimBone* banim = new AnimBone;
    pAnim->mAnims.push_back( banim);

    bool running = true;
    while( running )
    {
        std::string objectName = GetNextToken();

        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation.");
        else
        if( objectName == "}")
            break; // animation finished
        else
        if( objectName == "AnimationKey")
            ParseDataObjectAnimationKey( banim);
        else
        if( objectName == "AnimationOptions")
            ParseUnknownDataObject(); // not interested
        else
        if( objectName == "{")
        {
            // read frame name
            banim->mBoneName = GetNextToken();
            CheckForClosingBrace();
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation in x file");
            ParseUnknownDataObject();
        }
    }
}